

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::Regexp::RemoveLeadingString(Regexp *re,int n)

{
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  Regexp *that;
  Regexp *this;
  int iVar4;
  ostream *this_00;
  size_t __n;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  Regexp **__src;
  ulong uVar6;
  Regexp *stk [4];
  long local_1c8 [4];
  LogMessage local_1a8;
  
  uVar6 = 0;
  while( true ) {
    uVar1 = re->op_;
    if (uVar1 != '\x05') break;
    if (uVar6 < 4) {
      local_1c8[uVar6] = (long)re;
      uVar6 = uVar6 + 1;
    }
    if (re->nsub_ < 2) {
      paVar5 = &re->field_5;
    }
    else {
      paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    re = paVar5->subone_;
  }
  if (uVar1 != '\x03') {
    if (uVar1 != '\x04') goto LAB_001dcef1;
    iVar3 = (re->field_7).field_0.max_;
    iVar4 = iVar3 - n;
    if (iVar4 != 0 && n <= iVar3) {
      if (iVar3 + -1 != n) {
        (re->field_7).field_0.max_ = iVar4;
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_7).the_union_[1];
        __src = (Regexp **)((long)paVar5 + (long)n * 4);
        __n = (long)iVar4 << 2;
        goto LAB_001dcece;
      }
      iVar3 = *(int *)((long)(re->field_7).the_union_[1] + (long)n * 4);
      operator_delete__((re->field_7).the_union_[1]);
      (re->field_7).field_1.name_ = (string *)0x0;
      (re->field_7).field_0.max_ = iVar3;
      re->op_ = '\x03';
      goto LAB_001dcef1;
    }
    if ((re->field_7).the_union_[1] != (void *)0x0) {
      operator_delete__((re->field_7).the_union_[1]);
    }
    (re->field_7).field_1.name_ = (string *)0x0;
  }
  (re->field_7).field_0.max_ = 0;
  re->op_ = '\x02';
LAB_001dcef1:
  while( true ) {
    while( true ) {
      do {
        uVar6 = uVar6 - 1;
        if (uVar6 == 0xffffffffffffffff) {
          return;
        }
        this = (Regexp *)local_1c8[uVar6];
        if (this->nsub_ < 2) {
          paVar5 = &this->field_5;
        }
        else {
          paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
        }
      } while (paVar5->subone_->op_ != '\x02');
      Decref(paVar5->subone_);
      paVar5->submany_ = (Regexp **)0x0;
      uVar2 = this->nsub_;
      if (uVar2 != 2) break;
      that = paVar5[1].subone_;
      paVar5[1].submany_ = (Regexp **)0x0;
      Swap(this,that);
      Decref(that);
    }
    if (uVar2 < 2) break;
    this->nsub_ = uVar2 - 1;
    __src = (Regexp **)(paVar5 + 1);
    __n = (ulong)(ushort)(uVar2 - 1) << 3;
LAB_001dcece:
    memmove(paVar5,__src,__n);
  }
  LogMessage::LogMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/parse.cc"
             ,0x351);
  this_00 = std::operator<<(&local_1a8.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                            "Concat of ");
  std::ostream::operator<<(this_00,(uint)this->nsub_);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
}

Assistant:

void Regexp::RemoveLeadingString(Regexp* re, int n) {
  // Chase down concats to find first string.
  // For regexps generated by parser, nested concats are
  // flattened except when doing so would overflow the 16-bit
  // limit on the size of a concatenation, so we should never
  // see more than two here.
  Regexp* stk[4];
  size_t d = 0;
  while (re->op() == kRegexpConcat) {
    if (d < arraysize(stk))
      stk[d++] = re;
    re = re->sub()[0];
  }

  // Remove leading string from re.
  if (re->op() == kRegexpLiteral) {
    re->rune_ = 0;
    re->op_ = kRegexpEmptyMatch;
  } else if (re->op() == kRegexpLiteralString) {
    if (n >= re->nrunes_) {
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->op_ = kRegexpEmptyMatch;
    } else if (n == re->nrunes_ - 1) {
      Rune rune = re->runes_[re->nrunes_ - 1];
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->rune_ = rune;
      re->op_ = kRegexpLiteral;
    } else {
      re->nrunes_ -= n;
      memmove(re->runes_, re->runes_ + n, re->nrunes_ * sizeof re->runes_[0]);
    }
  }

  // If re is now empty, concatenations might simplify too.
  while (d > 0) {
    re = stk[--d];
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch) {
      sub[0]->Decref();
      sub[0] = NULL;
      // Delete first element of concat.
      switch (re->nsub()) {
        case 0:
        case 1:
          // Impossible.
          LOG(DFATAL) << "Concat of " << re->nsub();
          re->submany_ = NULL;
          re->op_ = kRegexpEmptyMatch;
          break;

        case 2: {
          // Replace re with sub[1].
          Regexp* old = sub[1];
          sub[1] = NULL;
          re->Swap(old);
          old->Decref();
          break;
        }

        default:
          // Slide down.
          re->nsub_--;
          memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
          break;
      }
    }
  }
}